

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsimd_avx.hpp
# Opt level: O1

batch * __thiscall
ear::PolarExtentCoreSimd<xsimd::avx>::weight_from_cos
          (batch *__return_storage_ptr__,PolarExtentCoreSimd<xsimd::avx> *this,
          PolarExtentCoreContext *ctx,batch cos_angle)

{
  undefined4 uVar1;
  float fVar2;
  undefined1 auVar3 [32];
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  batch *in_RAX;
  undefined1 auVar13 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  
  uVar1 = *(undefined4 *)&this[0xf].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar14._4_4_ = uVar1;
  auVar14._0_4_ = uVar1;
  auVar14._8_4_ = uVar1;
  auVar14._12_4_ = uVar1;
  auVar14._16_4_ = uVar1;
  auVar14._20_4_ = uVar1;
  auVar14._24_4_ = uVar1;
  auVar14._28_4_ = uVar1;
  auVar13 = in_ZMM0._0_32_;
  auVar14 = vcmpps_avx(auVar14,auVar13,2);
  auVar22 = vcmpps_avx(ZEXT432(0) << 0x20,ZEXT432(0) << 0x20,0xf);
  auVar15 = auVar22 & ~auVar14;
  if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar15 >> 0x7f,0) != '\0') ||
        (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar15 >> 0xbf,0) != '\0') ||
      (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar15[0x1f] < '\0') {
    uVar1 = *(undefined4 *)((long)&this[0xf].super_PolarExtentCore._vptr_PolarExtentCore + 4);
    auVar16._4_4_ = uVar1;
    auVar16._0_4_ = uVar1;
    auVar16._8_4_ = uVar1;
    auVar16._12_4_ = uVar1;
    auVar16._16_4_ = uVar1;
    auVar16._20_4_ = uVar1;
    auVar16._24_4_ = uVar1;
    auVar16._28_4_ = uVar1;
    auVar15 = vcmpps_avx(auVar13,auVar16,2);
    auVar22 = auVar22 & ~auVar15;
    if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar22 >> 0x7f,0) != '\0') ||
          (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar22 >> 0xbf,0) != '\0') ||
        (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar22[0x1f] < '\0')
    {
      fVar2 = *(float *)&this[0x11].super_PolarExtentCore._vptr_PolarExtentCore;
      auVar17._8_4_ = 0x7fffffff;
      auVar17._0_8_ = 0x7fffffff7fffffff;
      auVar17._12_4_ = 0x7fffffff;
      auVar17._16_4_ = 0x7fffffff;
      auVar17._20_4_ = 0x7fffffff;
      auVar17._24_4_ = 0x7fffffff;
      auVar17._28_4_ = 0x7fffffff;
      auVar22 = vandps_avx(auVar13,auVar17);
      auVar19._8_4_ = 0x3f000000;
      auVar19._0_8_ = 0x3f0000003f000000;
      auVar19._12_4_ = 0x3f000000;
      auVar19._16_4_ = 0x3f000000;
      auVar19._20_4_ = 0x3f000000;
      auVar19._24_4_ = 0x3f000000;
      auVar19._28_4_ = 0x3f000000;
      auVar24._0_4_ = auVar22._0_4_ * 0.5;
      auVar24._4_4_ = auVar22._4_4_ * 0.5;
      auVar24._8_4_ = auVar22._8_4_ * 0.5;
      auVar24._12_4_ = auVar22._12_4_ * 0.5;
      auVar24._16_4_ = auVar22._16_4_ * 0.5;
      auVar24._20_4_ = auVar22._20_4_ * 0.5;
      auVar24._28_36_ = in_ZMM7._28_36_;
      auVar24._24_4_ = auVar22._24_4_ * 0.5;
      auVar15 = vsubps_avx(auVar19,auVar24._0_32_);
      auVar15 = vsqrtps_avx(auVar15);
      auVar3 = vcmpps_avx(auVar19,auVar22,1);
      auVar15 = vblendvps_avx(auVar13,auVar15,auVar3);
      auVar22 = vandps_avx(auVar15,auVar17);
      auVar19 = vcmpps_avx(auVar19,auVar22,1);
      auVar18._8_4_ = 0x3f800000;
      auVar18._0_8_ = 0x3f8000003f800000;
      auVar18._12_4_ = 0x3f800000;
      auVar18._16_4_ = 0x3f800000;
      auVar18._20_4_ = 0x3f800000;
      auVar18._24_4_ = 0x3f800000;
      auVar18._28_4_ = 0x3f800000;
      auVar17 = vsubps_avx(auVar18,auVar22);
      auVar11._4_4_ = auVar17._4_4_ * 0.5;
      auVar11._0_4_ = auVar17._0_4_ * 0.5;
      auVar11._8_4_ = auVar17._8_4_ * 0.5;
      auVar11._12_4_ = auVar17._12_4_ * 0.5;
      auVar11._16_4_ = auVar17._16_4_ * 0.5;
      auVar11._20_4_ = auVar17._20_4_ * 0.5;
      auVar11._24_4_ = auVar17._24_4_ * 0.5;
      auVar11._28_4_ = 0x3f000000;
      auVar12._4_4_ = auVar15._4_4_ * auVar15._4_4_;
      auVar12._0_4_ = auVar15._0_4_ * auVar15._0_4_;
      auVar12._8_4_ = auVar15._8_4_ * auVar15._8_4_;
      auVar12._12_4_ = auVar15._12_4_ * auVar15._12_4_;
      auVar12._16_4_ = auVar15._16_4_ * auVar15._16_4_;
      auVar12._20_4_ = auVar15._20_4_ * auVar15._20_4_;
      auVar12._24_4_ = auVar15._24_4_ * auVar15._24_4_;
      auVar12._28_4_ = auVar17._28_4_;
      auVar17 = vblendvps_avx(auVar12,auVar11,auVar19);
      auVar11 = vsqrtps_avx(auVar17);
      auVar28._8_4_ = 0x80000000;
      auVar28._0_8_ = 0x8000000080000000;
      auVar28._12_4_ = 0x80000000;
      auVar28._16_4_ = 0x80000000;
      auVar28._20_4_ = 0x80000000;
      auVar28._24_4_ = 0x80000000;
      auVar28._28_4_ = 0x80000000;
      auVar11 = vblendvps_avx(auVar22,auVar11,auVar19);
      auVar22 = vandps_avx(auVar28,auVar15);
      fVar4 = auVar17._0_4_;
      fVar5 = auVar17._4_4_;
      fVar6 = auVar17._8_4_;
      fVar7 = auVar17._12_4_;
      fVar8 = auVar17._16_4_;
      fVar9 = auVar17._20_4_;
      fVar10 = auVar17._24_4_;
      auVar20._0_4_ =
           auVar11._0_4_ +
           ((((fVar4 * 0.0421632 + 0.024181312) * fVar4 + 0.045470025) * fVar4 + 0.074953005) *
            fVar4 + 0.16666752) * auVar11._0_4_ * fVar4;
      auVar20._4_4_ =
           auVar11._4_4_ +
           ((((fVar5 * 0.0421632 + 0.024181312) * fVar5 + 0.045470025) * fVar5 + 0.074953005) *
            fVar5 + 0.16666752) * auVar11._4_4_ * fVar5;
      auVar20._8_4_ =
           auVar11._8_4_ +
           ((((fVar6 * 0.0421632 + 0.024181312) * fVar6 + 0.045470025) * fVar6 + 0.074953005) *
            fVar6 + 0.16666752) * auVar11._8_4_ * fVar6;
      auVar20._12_4_ =
           auVar11._12_4_ +
           ((((fVar7 * 0.0421632 + 0.024181312) * fVar7 + 0.045470025) * fVar7 + 0.074953005) *
            fVar7 + 0.16666752) * auVar11._12_4_ * fVar7;
      auVar20._16_4_ =
           auVar11._16_4_ +
           ((((fVar8 * 0.0421632 + 0.024181312) * fVar8 + 0.045470025) * fVar8 + 0.074953005) *
            fVar8 + 0.16666752) * auVar11._16_4_ * fVar8;
      auVar20._20_4_ =
           auVar11._20_4_ +
           ((((fVar9 * 0.0421632 + 0.024181312) * fVar9 + 0.045470025) * fVar9 + 0.074953005) *
            fVar9 + 0.16666752) * auVar11._20_4_ * fVar9;
      auVar20._24_4_ =
           auVar11._24_4_ +
           ((((fVar10 * 0.0421632 + 0.024181312) * fVar10 + 0.045470025) * fVar10 + 0.074953005) *
            fVar10 + 0.16666752) * auVar11._24_4_ * fVar10;
      auVar20._28_4_ = auVar11._28_4_ + auVar17._28_4_;
      auVar25._8_4_ = 0x3fc90fdb;
      auVar25._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar25._12_4_ = 0x3fc90fdb;
      auVar25._16_4_ = 0x3fc90fdb;
      auVar25._20_4_ = 0x3fc90fdb;
      auVar25._24_4_ = 0x3fc90fdb;
      auVar25._28_4_ = 0x3fc90fdb;
      auVar27._0_4_ = auVar20._0_4_ + auVar20._0_4_;
      auVar27._4_4_ = auVar20._4_4_ + auVar20._4_4_;
      auVar27._8_4_ = auVar20._8_4_ + auVar20._8_4_;
      auVar27._12_4_ = auVar20._12_4_ + auVar20._12_4_;
      auVar27._16_4_ = auVar20._16_4_ + auVar20._16_4_;
      auVar27._20_4_ = auVar20._20_4_ + auVar20._20_4_;
      auVar27._24_4_ = auVar20._24_4_ + auVar20._24_4_;
      auVar27._28_4_ = auVar20._28_4_ + auVar20._28_4_;
      auVar15 = vsubps_avx(auVar25,auVar27);
      auVar15 = vblendvps_avx(auVar20,auVar15,auVar19);
      auVar21._0_4_ = (float)(auVar22._0_4_ ^ auVar15._0_4_);
      auVar21._4_4_ = (float)(auVar22._4_4_ ^ auVar15._4_4_);
      auVar21._8_4_ = (float)(auVar22._8_4_ ^ auVar15._8_4_);
      auVar21._12_4_ = (float)(auVar22._12_4_ ^ auVar15._12_4_);
      auVar21._16_4_ = (float)(auVar22._16_4_ ^ auVar15._16_4_);
      auVar21._20_4_ = (float)(auVar22._20_4_ ^ auVar15._20_4_);
      auVar21._24_4_ = (float)(auVar22._24_4_ ^ auVar15._24_4_);
      auVar21._28_4_ = (float)(auVar22._28_4_ ^ auVar15._28_4_);
      auVar22._0_4_ = auVar21._0_4_ + auVar21._0_4_;
      auVar22._4_4_ = auVar21._4_4_ + auVar21._4_4_;
      auVar22._8_4_ = auVar21._8_4_ + auVar21._8_4_;
      auVar22._12_4_ = auVar21._12_4_ + auVar21._12_4_;
      auVar22._16_4_ = auVar21._16_4_ + auVar21._16_4_;
      auVar22._20_4_ = auVar21._20_4_ + auVar21._20_4_;
      auVar22._24_4_ = auVar21._24_4_ + auVar21._24_4_;
      auVar22._28_4_ = auVar21._28_4_ + auVar21._28_4_;
      auVar22 = vblendvps_avx(auVar21,auVar22,auVar3);
      auVar23._8_4_ = 0xbf000000;
      auVar23._0_8_ = 0xbf000000bf000000;
      auVar23._12_4_ = 0xbf000000;
      auVar23._16_4_ = 0xbf000000;
      auVar23._20_4_ = 0xbf000000;
      auVar23._24_4_ = 0xbf000000;
      auVar23._28_4_ = 0xbf000000;
      auVar26._8_4_ = 0x40490fdb;
      auVar26._0_8_ = 0x40490fdb40490fdb;
      auVar26._12_4_ = 0x40490fdb;
      auVar26._16_4_ = 0x40490fdb;
      auVar26._20_4_ = 0x40490fdb;
      auVar26._24_4_ = 0x40490fdb;
      auVar26._28_4_ = 0x40490fdb;
      auVar15 = vcmpps_avx(auVar13,auVar23,1);
      auVar17 = vsubps_avx(auVar26,auVar22);
      auVar22 = vblendvps_avx(auVar22,auVar17,auVar15);
      auVar15 = vsubps_avx(auVar25,auVar22);
      auVar22 = vblendvps_avx(auVar15,auVar22,auVar3);
      fVar4 = *(float *)((long)&this[0x11].super_PolarExtentCore._vptr_PolarExtentCore + 4);
      auVar15._0_4_ = auVar22._0_4_ * fVar2 + fVar4;
      auVar15._4_4_ = auVar22._4_4_ * fVar2 + fVar4;
      auVar15._8_4_ = auVar22._8_4_ * fVar2 + fVar4;
      auVar15._12_4_ = auVar22._12_4_ * fVar2 + fVar4;
      auVar15._16_4_ = auVar22._16_4_ * fVar2 + fVar4;
      auVar15._20_4_ = auVar22._20_4_ * fVar2 + fVar4;
      auVar15._24_4_ = auVar22._24_4_ * fVar2 + fVar4;
      auVar15._28_4_ = fVar2 + fVar4;
      auVar22 = vcmpps_avx(auVar13,auVar16,6);
      auVar22 = vandps_avx(auVar22,auVar15);
      vblendvps_avx(auVar22,auVar18,auVar14);
    }
  }
  return in_RAX;
}

Assistant:

inline batch<float, A> broadcast(float val, requires_arch<avx>) noexcept
        {
            return _mm256_set1_ps(val);
        }